

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.h
# Opt level: O2

int read_skip_txfm(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((cm->seg).enabled != '\0') &&
     (((cm->seg).feature_mask[(ulong)(uint)segment_id & 0xff] & 0x40) != 0)) {
    return 1;
  }
  if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)xd->above_mbmi->skip_txfm;
  }
  if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)xd->left_mbmi->skip_txfm;
  }
  iVar1 = aom_read_symbol_(r,xd->tile_ctx->skip_txfm_cdfs[uVar3 + uVar2],2);
  return iVar1;
}

Assistant:

static inline int segfeature_active(const struct segmentation *seg,
                                    uint8_t segment_id,
                                    SEG_LVL_FEATURES feature_id) {
  return seg->enabled && (seg->feature_mask[segment_id] & (1 << feature_id));
}